

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O3

void __thiscall re2::PCRE::PCRE(PCRE *this,char *pattern,Option option)

{
  (this->pattern_)._M_dataplus._M_p = (pointer)&(this->pattern_).field_2;
  (this->pattern_)._M_string_length = 0;
  (this->pattern_).field_2._M_local_buf[0] = '\0';
  Init(this,pattern,option,0,0,true);
  return;
}

Assistant:

PCRE::PCRE(const char* pattern, Option option) {
  Init(pattern, option, 0, 0, true);
}